

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

bool __thiscall GlobOptBlockData::IsSwitchInt32TypeSpecialized(GlobOptBlockData *this,Instr *instr)

{
  bool bVar1;
  RegOpnd *pRVar2;
  
  bVar1 = GlobOpt::IsSwitchOptEnabledForIntTypeSpec(instr->m_func->topFunc);
  if (bVar1) {
    bVar1 = IR::Opnd::IsRegOpnd(instr->m_src1);
    if (bVar1) {
      pRVar2 = IR::Opnd::AsRegOpnd(instr->m_src1);
      bVar1 = IsInt32TypeSpecialized(this,&pRVar2->m_sym->super_Sym);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool
GlobOptBlockData::IsSwitchInt32TypeSpecialized(IR::Instr const * instr) const
{
    return GlobOpt::IsSwitchOptEnabledForIntTypeSpec(instr->m_func->GetTopFunc())
        && instr->GetSrc1()->IsRegOpnd()
        && this->IsInt32TypeSpecialized(instr->GetSrc1()->AsRegOpnd()->m_sym);
}